

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteKvIoPageDontJournal(unqlite_page *pRaw)

{
  uchar *puVar1;
  Bitvec *p;
  pgno i;
  int iVar2;
  Page *pPage;
  
  if ((((pRaw != (unqlite_page *)0x0) && (puVar1 = pRaw[1].zData, 1 < *(int *)(puVar1 + 0x1f0))) &&
      (*(int *)(puVar1 + 0x204) == 0)) && (p = *(Bitvec **)(puVar1 + 0x198), p != (Bitvec *)0x0)) {
    i = pRaw->iPage;
    iVar2 = unqliteBitvecTest(p,i);
    if (iVar2 == 0) {
      unqliteBitvecSet(p,i);
    }
  }
  return 0;
}

Assistant:

static int unqliteKvIoPageDontJournal(unqlite_page *pRaw)
{
	Page *pPage = (Page *)pRaw;
	Pager *pPager;
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	pPager = pPage->pPager;
	if( pPager->iState >= PAGER_WRITER_LOCKED ){
		if( !pPager->no_jrnl && pPager->pVec && !unqliteBitvecTest(pPager->pVec,pPage->pgno) ){
			unqliteBitvecSet(pPager->pVec,pPage->pgno);
		}
	}
	return UNQLITE_OK;
}